

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Refal2::CScanner::processingBeginOfQualifier(CScanner *this,char c)

{
  bool bVar1;
  char c_local;
  CScanner *this_local;
  
  bVar1 = IsFirstWordLetter(c);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)
               &(this->super_CParser).super_CDirectiveParser.super_CRuleParser.
                super_CQualifierParser.token.word,c);
    this->state = S_Qualifier;
  }
  else {
    error(this,E_UnexpectedCharacterInQualifier,c);
    this->state = S_Initial;
    processing(this,c);
  }
  return;
}

Assistant:

void CScanner::processingBeginOfQualifier( char c )
{
	if( IsFirstWordLetter( c ) ) {
		token.word = c;
		state = S_Qualifier;
	} else {
		error( E_UnexpectedCharacterInQualifier, c );
		state = S_Initial;
		processing( c );
	}
}